

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineColorWriteCreateInfoEXT *create_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info)

{
  void *__src;
  undefined8 uVar1;
  VkBool32 *pVVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t size;
  
  puVar3 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar3 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)create_info;
    pvVar4 = create_info->pNext;
    pVVar2 = create_info->pColorWriteEnables;
    puVar3[2] = *(undefined8 *)&create_info->attachmentCount;
    puVar3[3] = pVVar2;
    *puVar3 = uVar1;
    puVar3[1] = pvVar4;
  }
  if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
     (dynamic_state_info->color_write_enable != false)) {
    puVar3[3] = 0;
  }
  else {
    if ((ulong)*(uint *)(puVar3 + 2) == 0) {
      pvVar4 = (void *)0x0;
    }
    else {
      __src = (void *)puVar3[3];
      size = (ulong)*(uint *)(puVar3 + 2) << 2;
      pvVar4 = ScratchAllocator::allocate_raw(alloc,size,0x10);
      if (pvVar4 != (void *)0x0) {
        memmove(pvVar4,__src,size);
      }
    }
    puVar3[3] = pvVar4;
  }
  return puVar3;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineColorWriteCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	auto *color_write = copy(create_info, 1, alloc);
	if (dynamic_state_info && !dynamic_state_info->color_write_enable)
		color_write->pColorWriteEnables = copy(color_write->pColorWriteEnables, color_write->attachmentCount, alloc);
	else
		color_write->pColorWriteEnables = nullptr;
	return color_write;
}